

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O2

void google::protobuf::internal::SerializeInternal
               (uint8 *base,FieldMetadata *field_metadata_table,int32 num_fields,
               CodedOutputStream *output)

{
  double *field;
  uint field_00;
  float fVar1;
  ulong uVar2;
  uint32 *has_bits_array;
  bool bVar3;
  
  uVar2 = 0;
  if (0 < num_fields) {
    uVar2 = (ulong)(uint)num_fields;
  }
  do {
    bVar3 = uVar2 == 0;
    uVar2 = uVar2 - 1;
    if (bVar3) {
      return;
    }
    field_00 = field_metadata_table->type;
    if (100 < field_00) {
switchD_0020a9f7_caseD_12:
      SerializeNotImplemented(field_00);
      goto LAB_0020b13c;
    }
    field = (double *)(base + field_metadata_table->offset);
    switch(field_00) {
    case 0:
      if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
           (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_0020ae0f:
        SingularFieldHelper<1>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
      }
      break;
    case 1:
      if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
           (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_0020ae4c:
        SingularFieldHelper<2>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
      }
      break;
    case 2:
      if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
           (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_0020b04e:
        SingularFieldHelper<3>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
      }
      break;
    case 3:
      if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
           (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_0020ad7d:
        SingularFieldHelper<4>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
      }
      break;
    case 4:
      fVar1 = (float)(*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
                      (field_metadata_table->has_offset & 0x1f) & 1);
      goto joined_r0x0020adee;
    case 5:
      if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
           (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_0020ad2c:
        SingularFieldHelper<6>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
      }
      break;
    case 6:
      fVar1 = (float)(*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
                      (field_metadata_table->has_offset & 0x1f) & 1);
      goto joined_r0x0020aeda;
    case 7:
      if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
           (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_0020acc1:
        SingularFieldHelper<8>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
      }
      break;
    case 8:
    case 0xb:
      if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
           (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_0020aa48:
        SingularFieldHelper<9>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
      }
      break;
    case 9:
      if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
           (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_0020af05:
        SingularFieldHelper<10>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
      }
      break;
    case 10:
      if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
           (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_0020ae82:
        SingularFieldHelper<11>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
      }
      break;
    case 0xc:
      fVar1 = (float)(*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
                      (field_metadata_table->has_offset & 0x1f) & 1);
      goto joined_r0x0020af38;
    case 0xd:
      fVar1 = (float)(*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
                      (field_metadata_table->has_offset & 0x1f) & 1);
      goto joined_r0x0020add5;
    case 0xe:
      fVar1 = (float)(*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
                      (field_metadata_table->has_offset & 0x1f) & 1);
      goto joined_r0x0020abc2;
    case 0xf:
      if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
           (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_0020af8f:
        SingularFieldHelper<16>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
      }
      break;
    case 0x10:
      fVar1 = (float)(*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
                      (field_metadata_table->has_offset & 0x1f) & 1);
      goto joined_r0x0020afa2;
    case 0x11:
      if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
           (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_0020b098:
        SingularFieldHelper<18>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
      }
      break;
    default:
      goto switchD_0020a9f7_caseD_12;
    case 0x14:
      if ((*field != 0.0) || (NAN(*field))) goto LAB_0020ae0f;
      break;
    case 0x15:
      if ((*(float *)field != 0.0) || (NAN(*(float *)field))) goto LAB_0020ae4c;
      break;
    case 0x16:
      if (*field != 0.0) goto LAB_0020b04e;
      break;
    case 0x17:
      if (*field != 0.0) goto LAB_0020ad7d;
      break;
    case 0x18:
      fVar1 = *(float *)field;
joined_r0x0020adee:
      if (fVar1 != 0.0) {
LAB_0020b128:
        SingularFieldHelper<5>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
      }
      break;
    case 0x19:
      if (*field != 0.0) goto LAB_0020ad2c;
      break;
    case 0x1a:
      fVar1 = *(float *)field;
joined_r0x0020aeda:
      if (fVar1 != 0.0) {
LAB_0020aee0:
        SingularFieldHelper<7>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
      }
      break;
    case 0x1b:
      if (*(char *)field != '\0') goto LAB_0020acc1;
      break;
    case 0x1c:
    case 0x1f:
      if (*(long *)(((ulong)*field & 0xfffffffffffffffe) + 8) != 0) goto LAB_0020aa48;
      break;
    case 0x1d:
      if (*field != 0.0) goto LAB_0020af05;
      break;
    case 0x1e:
      if (*field != 0.0) goto LAB_0020ae82;
      break;
    case 0x20:
      fVar1 = *(float *)field;
joined_r0x0020af38:
      if (fVar1 != 0.0) {
LAB_0020af3e:
        SingularFieldHelper<13>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
      }
      break;
    case 0x21:
      fVar1 = *(float *)field;
joined_r0x0020add5:
      if (fVar1 != 0.0) {
LAB_0020addb:
        SingularFieldHelper<14>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
      }
      break;
    case 0x22:
      fVar1 = *(float *)field;
joined_r0x0020abc2:
      if (fVar1 != 0.0) {
LAB_0020b0e3:
        SingularFieldHelper<15>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
      }
      break;
    case 0x23:
      if (*field != 0.0) goto LAB_0020af8f;
      break;
    case 0x24:
      fVar1 = *(float *)field;
joined_r0x0020afa2:
      if (fVar1 != 0.0) {
LAB_0020aff4:
        SingularFieldHelper<17>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
      }
      break;
    case 0x25:
      if (*field != 0.0) goto LAB_0020b098;
      break;
    case 0x28:
      RepeatedFieldHelper<1>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x29:
      RepeatedFieldHelper<2>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x2a:
      RepeatedFieldHelper<3>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x2b:
      RepeatedFieldHelper<4>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x2c:
      RepeatedFieldHelper<5>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x2d:
      RepeatedFieldHelper<6>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x2e:
      RepeatedFieldHelper<7>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x2f:
      RepeatedFieldHelper<8>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x30:
    case 0x33:
      RepeatedFieldHelper<9>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x31:
      RepeatedFieldHelper<10>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x32:
      RepeatedFieldHelper<11>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x34:
      RepeatedFieldHelper<13>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x35:
      RepeatedFieldHelper<14>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x36:
      RepeatedFieldHelper<15>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x37:
      RepeatedFieldHelper<16>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x38:
      RepeatedFieldHelper<17>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x39:
      RepeatedFieldHelper<18>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x3c:
      PackedFieldHelper<1>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x3d:
      PackedFieldHelper<2>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x3e:
      PackedFieldHelper<3>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x3f:
      PackedFieldHelper<4>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x40:
      PackedFieldHelper<5>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x41:
      PackedFieldHelper<6>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x42:
      PackedFieldHelper<7>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x43:
      PackedFieldHelper<8>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x44:
    case 0x45:
    case 0x46:
    case 0x47:
      PackedFieldHelper<9>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x48:
      PackedFieldHelper<13>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x49:
      PackedFieldHelper<14>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x4a:
      PackedFieldHelper<15>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x4b:
      PackedFieldHelper<16>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x4c:
      PackedFieldHelper<17>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x4d:
      PackedFieldHelper<18>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x50:
      if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3)
      goto LAB_0020ae0f;
      break;
    case 0x51:
      if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3)
      goto LAB_0020ae4c;
      break;
    case 0x52:
      if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3)
      goto LAB_0020b04e;
      break;
    case 0x53:
      if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3)
      goto LAB_0020ad7d;
      break;
    case 0x54:
      if (*(uint *)(base + field_metadata_table->has_offset) != field_metadata_table->tag >> 3)
      break;
      goto LAB_0020b128;
    case 0x55:
      if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3)
      goto LAB_0020ad2c;
      break;
    case 0x56:
      if (*(uint *)(base + field_metadata_table->has_offset) != field_metadata_table->tag >> 3)
      break;
      goto LAB_0020aee0;
    case 0x57:
      if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3)
      goto LAB_0020acc1;
      break;
    case 0x58:
    case 0x5b:
      if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3)
      goto LAB_0020aa48;
      break;
    case 0x59:
      if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3)
      goto LAB_0020af05;
      break;
    case 0x5a:
      if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3)
      goto LAB_0020ae82;
      break;
    case 0x5c:
      if (*(uint *)(base + field_metadata_table->has_offset) != field_metadata_table->tag >> 3)
      break;
      goto LAB_0020af3e;
    case 0x5d:
      if (*(uint *)(base + field_metadata_table->has_offset) != field_metadata_table->tag >> 3)
      break;
      goto LAB_0020addb;
    case 0x5e:
      if (*(uint *)(base + field_metadata_table->has_offset) != field_metadata_table->tag >> 3)
      break;
      goto LAB_0020b0e3;
    case 0x5f:
      if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3)
      goto LAB_0020af8f;
      break;
    case 0x60:
      if (*(uint *)(base + field_metadata_table->has_offset) != field_metadata_table->tag >> 3)
      break;
      goto LAB_0020aff4;
    case 0x61:
      if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3)
      goto LAB_0020b098;
      break;
    case 100:
      (*(code *)field_metadata_table->ptr)
                (base,(ulong)field_metadata_table->offset,field_metadata_table->tag,
                 field_metadata_table->has_offset,output);
    }
LAB_0020b13c:
    field_metadata_table = field_metadata_table + 1;
  } while( true );
}

Assistant:

void SerializeInternal(const uint8* base,
                       const FieldMetadata* field_metadata_table,
                       int32 num_fields, io::CodedOutputStream* output) {
  SpecialSerializer func = nullptr;
  for (int i = 0; i < num_fields; i++) {
    const FieldMetadata& field_metadata = field_metadata_table[i];
    const uint8* ptr = base + field_metadata.offset;
    switch (field_metadata.type) {
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_DOUBLE);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_FLOAT);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_INT64);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_UINT64);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_INT32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_FIXED64);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_FIXED32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_BOOL);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_STRING);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_GROUP);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_MESSAGE);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_BYTES);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_UINT32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_ENUM);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_SFIXED32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_SFIXED64);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_SINT32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_SINT64);

      // Special cases
      case FieldMetadata::kSpecial:
        func = reinterpret_cast<SpecialSerializer>(
            const_cast<void*>(field_metadata.ptr));
        func(base, field_metadata.offset, field_metadata.tag,
             field_metadata.has_offset, output);
        break;
      default:
        // __builtin_unreachable()
        SerializeNotImplemented(field_metadata.type);
    }
  }
}